

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_storage.cpp
# Opt level: O3

ssize_t __thiscall
libtorrent::aux::posix_storage::write(posix_storage *this,int __fd,void *__buf,size_t __n)

{
  pointer psVar1;
  bool bVar2;
  char cVar3;
  open_mode_t mode;
  file_index_t fVar4;
  int iVar5;
  int64_t iVar6;
  ulong uVar7;
  void *__buf_00;
  ssize_t sVar8;
  size_t sVar9;
  int *piVar10;
  undefined8 uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  generic_error_category *pgVar15;
  file_storage *pfVar16;
  int in_R8D;
  int in_R9D;
  file_storage *this_00;
  long lVar17;
  _Alloc_hider __s;
  undefined1 uVar18;
  peer_request pVar19;
  int *in_stack_00000008;
  error_code e;
  storage_error *local_70;
  undefined4 local_60;
  char cStack_5c;
  system_error_category *psStack_58;
  _Alloc_hider local_50;
  size_t local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  this_00 = (this->m_mapped_files)._M_t.
            super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
            .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
  if (this_00 == (file_storage *)0x0) {
    this_00 = this->m_files;
  }
  lVar17 = (long)in_R9D + (long)this_00->m_piece_length * (long)in_R8D;
  mode.m_val = (uint)file_storage::file_index_at_offset(this_00,lVar17);
  iVar6 = file_storage::file_offset(this_00,(file_index_t)mode.m_val);
  if ((long)__n < 1) {
    uVar7 = 0;
  }
  else {
    local_70 = (storage_error *)(lVar17 - iVar6);
    local_40 = &this->m_stat_cache;
    uVar7 = 0;
    local_38 = this;
    do {
      iVar12 = (int)__n;
      iVar6 = file_storage::file_size(this_00,(file_index_t)mode.m_val);
      local_48 = __n;
      if (iVar6 < (long)&(local_70->ec).val_ + (long)iVar12) {
        iVar6 = file_storage::file_size(this_00,(file_index_t)mode.m_val);
        uVar13 = (int)iVar6 - (int)local_70;
        __n = (size_t)uVar13;
        if ((int)uVar13 < 1) {
          __n = 0;
        }
      }
      iVar14 = (int)__n;
      if (iVar14 == 0) {
        iVar14 = (int)local_48;
        do {
          mode.m_val = mode.m_val + 1;
          fVar4 = file_storage::end_file(this_00);
          if (fVar4.m_val <= (int)mode.m_val) {
            return uVar7;
          }
          iVar6 = file_storage::file_size(this_00,(file_index_t)mode.m_val);
        } while (iVar6 == 0);
        iVar6 = file_storage::file_size(this_00,(file_index_t)mode.m_val);
        if (iVar6 < iVar12) {
          iVar6 = file_storage::file_size(this_00,(file_index_t)mode.m_val);
          iVar14 = (int)iVar6;
          if (iVar14 < 1) {
            iVar14 = 0;
          }
        }
        local_70 = (storage_error *)0x0;
      }
      pfVar16 = (this->m_mapped_files)._M_t.
                super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
                ._M_t.
                super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
                .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
      if (pfVar16 == (file_storage *)0x0) {
        pfVar16 = this->m_files;
      }
      bVar2 = file_storage::pad_file_at(pfVar16,(file_index_t)mode.m_val);
      iVar12 = iVar14;
      if (!bVar2) {
        __buf_00 = (void *)(long)iVar14;
        psVar1 = (this->m_file_priority).
                 super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 .
                 super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((((int)mode.m_val <
              *(int *)&(this->m_file_priority).
                       super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                       .
                       super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (int)psVar1) &&
            (psVar1[(int)mode.m_val].m_val == '\0')) &&
           (bVar2 = use_partfile(this,(file_index_t)mode.m_val), bVar2)) {
          local_60 = 0;
          _cStack_5c = _cStack_5c & 0xffffff00;
          psStack_58 = &boost::system::detail::cat_holder<void>::system_category_instance;
          pfVar16 = (this->m_mapped_files)._M_t.
                    super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
                    .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
          if (pfVar16 == (file_storage *)0x0) {
            pfVar16 = this->m_files;
          }
          pVar19 = file_storage::map_file(pfVar16,(file_index_t)mode.m_val,(int64_t)local_70,0);
          sVar8 = posix_part_file::write
                            ((this->m_part_file)._M_t.
                             super___uniq_ptr_impl<libtorrent::aux::posix_part_file,_std::default_delete<libtorrent::aux::posix_part_file>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::posix_part_file_*,_std::default_delete<libtorrent::aux::posix_part_file>_>
                             .super__Head_base<0UL,_libtorrent::aux::posix_part_file_*,_false>.
                             _M_head_impl,(int)__buf,__buf_00,(ulong)(uint)pVar19.piece.m_val.m_val)
          ;
          iVar12 = (int)sVar8;
          if (cStack_5c == '\x01') {
            *(ulong *)in_stack_00000008 = CONCAT44(_cStack_5c,local_60);
            ((__uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
              *)(in_stack_00000008 + 2))->_M_t =
                 (tuple<libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>)
                 psStack_58;
            *(undefined1 *)((long)in_stack_00000008 + 0x13) = 0x25;
          }
        }
        else {
          open_file((posix_storage *)&stack0xffffffffffffffa0,(file_index_t)(int)this,mode,1,
                    local_70);
          iVar12 = -1;
          __s._M_p = (pointer)CONCAT44(_cStack_5c,local_60);
          if ((char)in_stack_00000008[1] == '\0') {
            *(undefined1 *)((long)in_stack_00000008 + 0x13) = 7;
            local_50._M_p = __s._M_p;
            sVar9 = fwrite(__buf,1,(size_t)__buf_00,(FILE *)__s._M_p);
            __s._M_p = local_50._M_p;
            iVar12 = (int)sVar9;
            if ((void *)(long)iVar12 != __buf_00) {
              iVar5 = ferror((FILE *)local_50._M_p);
              if (iVar5 == 0) {
                pgVar15 = (generic_error_category *)libtorrent_category();
                *in_stack_00000008 = 0x17;
                uVar18 = 1;
                if ((((error_category *)pgVar15)->id_ != 0x8fafd21e25c5e09b) &&
                   (((error_category *)pgVar15)->id_ != 0xb2ab117a257edf0d)) {
                  iVar5 = (*((error_category *)pgVar15)->_vptr_error_category[6])(pgVar15,0x17);
                  uVar18 = (undefined1)iVar5;
                }
              }
              else {
                piVar10 = __errno_location();
                iVar5 = *piVar10;
                *in_stack_00000008 = iVar5;
                uVar18 = iVar5 != 0;
                pgVar15 = &boost::system::detail::cat_holder<void>::generic_category_instance;
              }
              *(undefined1 *)(in_stack_00000008 + 1) = uVar18;
              *(generic_error_category **)(in_stack_00000008 + 2) = pgVar15;
            }
            stat_cache::set_dirty((stat_cache *)local_40,(file_index_t)mode.m_val);
          }
          this = (posix_storage *)local_38;
          if ((FILE *)__s._M_p != (FILE *)0x0) {
            fclose((FILE *)__s._M_p);
            this = (posix_storage *)local_38;
          }
        }
      }
      sVar9 = local_48;
      uVar18 = (undefined1)(mode.m_val >> 0x10);
      if (*in_stack_00000008 != 0) {
        *(short *)(in_stack_00000008 + 4) = (short)mode.m_val;
        *(undefined1 *)((long)in_stack_00000008 + 0x12) = uVar18;
        return uVar7;
      }
      if ((0 < iVar14) && (iVar12 == 0)) {
        *(undefined1 *)((long)in_stack_00000008 + 0x13) = 8;
        if ((DAT_004ecee8 == -0x70502de1da3a1f65) || (DAT_004ecee8 == -0x4d54ee85da8120f3)) {
LAB_002966b5:
          uVar11 = 0x100000002;
        }
        else {
          cVar3 = (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                            (&boost::asio::error::get_misc_category()::instance,2);
          uVar11 = 2;
          if (cVar3 != '\0') goto LAB_002966b5;
        }
        *(undefined8 *)in_stack_00000008 = uVar11;
        *(pointer_____offset_0x10___ **)(in_stack_00000008 + 2) =
             &boost::asio::error::get_misc_category()::instance;
        *(short *)(in_stack_00000008 + 4) = (short)mode.m_val;
        *(undefined1 *)((long)in_stack_00000008 + 0x12) = uVar18;
      }
      lVar17 = (long)iVar12;
      __buf = (void *)((long)__buf + lVar17);
      __n = sVar9 - lVar17;
      local_70 = (storage_error *)((long)&(local_70->ec).val_ + lVar17);
      uVar7 = (ulong)(uint)((int)uVar7 + iVar12);
    } while (0 < (long)__n);
  }
  return uVar7;
}

Assistant:

int posix_storage::write(settings_interface const&
		, span<char const> buffer
		, piece_index_t const piece, int const offset
		, storage_error& error)
	{
#ifdef TORRENT_SIMULATE_SLOW_WRITE
		std::this_thread::sleep_for(milliseconds(rand() % 800));
#endif
		return readwrite(files(), buffer, piece, offset, error
			, [this](file_index_t const file_index
				, std::int64_t const file_offset
				, span<char const> buf, storage_error& ec)
		{
			if (files().pad_file_at(file_index))
			{
				// writing to a pad-file is a no-op
				return int(buf.size());
			}

			if (file_index < m_file_priority.end_index()
				&& m_file_priority[file_index] == dont_download
				&& use_partfile(file_index))
			{
				TORRENT_ASSERT(m_part_file);

				error_code e;
				peer_request map = files().map_file(file_index
					, file_offset, 0);
				int const ret = m_part_file->write(buf, map.piece, map.start, e);

				if (e)
				{
					ec.ec = e;
					ec.operation = operation_t::partfile_write;
				}
				return ret;
			}

			file_pointer const f = open_file(file_index, open_mode::write
				, file_offset, ec);
			if (ec.ec) return -1;

			// set this unconditionally in case the upper layer would like to treat
			// short reads as errors
			ec.operation = operation_t::file_write;

			int ret = 0;
			auto const r = static_cast<int>(std::fwrite(buf.data(), 1
				, static_cast<std::size_t>(buf.size()), f.file()));
			if (r != buf.size())
			{
				if (std::ferror(f.file())) ec.ec.assign(errno, generic_category());
				else ec.ec.assign(errors::file_too_short, libtorrent_category());
			}
			ret += r;

			// invalidate our stat cache for this file, since
			// we're writing to it
			m_stat_cache.set_dirty(file_index);
			return ret;
		});
	}